

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall CLIntercept::logError(CLIntercept *this,char *functionName,cl_int errorCode)

{
  mutex *__mutex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  undefined8 uVar5;
  double __x;
  ostringstream ss;
  string local_1b8;
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"ERROR! ",7);
  if (functionName == (char *)0x0) {
    std::ios::clear((int)&local_1b8 + (int)*(undefined8 *)(local_198[0] + -0x18) + 0x20);
  }
  else {
    sVar3 = strlen(functionName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,functionName,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," returned ",10);
  CEnumNameMap::name_abi_cxx11_(&local_1b8,&this->m_EnumNameMap,errorCode);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,errorCode);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
  paVar1 = &local_1b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  __mutex = &this->m_Mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    __x = (double)std::__cxx11::stringbuf::str();
    log(this,__x);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
    return;
  }
  uVar5 = std::__throw_system_error(iVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  _Unwind_Resume(uVar5);
}

Assistant:

void CLIntercept::logError(
    const char* functionName,
    cl_int errorCode )
{
    std::ostringstream  ss;
    ss << "ERROR! " << functionName << " returned " << enumName().name(errorCode) << " (" << errorCode << ")\n";

    std::lock_guard<std::mutex> lock(m_Mutex);
    log( ss.str() );
}